

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O2

avl_node * avl_next(avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  
  if (node == (avl_node *)0x0) {
    return (avl_node *)0x0;
  }
  paVar2 = node->right;
  paVar1 = node;
  if (node->right == (avl_node *)0x0) {
    paVar2 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
    if (paVar2 == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    paVar1 = (avl_node *)0x0;
    while (paVar3 = paVar2, paVar3 != (avl_node *)0x0) {
      if (paVar3->left == node) {
        return paVar3;
      }
      node = paVar3;
      paVar2 = (avl_node *)((ulong)paVar3->parent & 0xfffffffffffffffc);
    }
  }
  else {
    while (paVar3 = paVar2, paVar3 != (avl_node *)0x0) {
      paVar1 = paVar3;
      paVar2 = paVar3->left;
    }
  }
  return paVar1;
}

Assistant:

struct avl_node* avl_next(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->next;
#else

    struct avl_node *p;

    // smallest value of right subtree
    if (node->right) {
        p = node;
        node = node->right;
        while (node) {
            p = node;
            node = node->left;
        }
        return p;
    }

    // node does not have right child
    if (avl_parent(node)) {
        // find first parent that has right child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->left == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}